

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t>::LoadNextGroup
          (BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  hugeint_t *this_00;
  BitpackingMode BVar1;
  uint uVar2;
  uint *puVar3;
  uint64_t uVar4;
  uint8_t uVar5;
  uint64_t *puVar6;
  InternalException *this_01;
  string local_40;
  
  this->current_group_offset = 0;
  puVar3 = (uint *)this->bitpacking_metadata_ptr;
  uVar2 = *puVar3;
  this->current_group =
       (bitpacking_metadata_t)
       ((ulong)(uVar2 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar3 + 3));
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar3 + -1);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  puVar6 = (uint64_t *)
           (((this->handle).node.ptr)->buffer +
           (ulong)(uVar2 & 0xffffff) + this->current_segment->offset);
  this->current_group_ptr = (data_ptr_t)puVar6;
  BVar1 = (this->current_group).mode;
  if (BVar1 - 3 < 3) {
    uVar4 = puVar6[1];
    (this->current_frame_of_reference).lower = *puVar6;
    (this->current_frame_of_reference).upper = uVar4;
    this_00 = (hugeint_t *)(puVar6 + 2);
    this->current_group_ptr = (data_ptr_t)this_00;
    if (BVar1 == CONSTANT_DELTA) {
      uVar4 = puVar6[3];
      (this->current_constant).lower = this_00->lower;
      (this->current_constant).upper = uVar4;
    }
    else {
      uVar5 = hugeint_t::operator_cast_to_unsigned_char(this_00);
      this->current_width = uVar5;
      puVar6 = (uint64_t *)this->current_group_ptr;
      this->current_group_ptr = (data_ptr_t)(puVar6 + 2);
      if ((this->current_group).mode != DELTA_FOR) {
        return;
      }
      uVar4 = puVar6[3];
      (this->current_delta_offset).lower = puVar6[2];
      (this->current_delta_offset).upper = uVar4;
    }
    puVar6 = puVar6 + 4;
  }
  else {
    if (BVar1 != CONSTANT) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid bitpacking mode","");
      InternalException::InternalException(this_01,&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = puVar6[1];
    (this->current_constant).lower = *puVar6;
    (this->current_constant).upper = uVar4;
    puVar6 = puVar6 + 2;
  }
  this->current_group_ptr = (data_ptr_t)puVar6;
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}